

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

ostream * pstack::operator<<(ostream *os,
                            JSON<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_char>
                            *jt)

{
  ostream *poVar1;
  JObject *pJVar2;
  JObject local_30;
  char local_1a [2];
  
  local_30.sep = "";
  local_30.os = os;
  std::operator<<(os,"{ ");
  local_1a[0] = '\0';
  pJVar2 = JObject::field<char[5],std::__cxx11::string,char>
                     (&local_30,(char (*) [5])0x14203d,&jt->object->first,local_1a);
  local_1a[1] = 0;
  pJVar2 = JObject::field<char[5],int,char>
                     (pJVar2,(char (*) [5])0x142e99,&jt->object->second,local_1a + 1);
  poVar1 = pJVar2->os;
  JObject::~JObject(&local_30);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<std::pair<std::string, int>> &jt)
{
    return JObject(os)
        .field("file", jt.object.first)
        .field("line", jt.object.second);
}